

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

void __thiscall proto2_unittest::RecursiveMessage::Clear(RecursiveMessage *this)

{
  ulong uVar1;
  RecursiveMessage *this_00;
  anon_union_24_1_493b367e_for_RecursiveMessage_3 aVar2;
  undefined8 *puVar3;
  char *failure_msg;
  int line;
  char *file;
  LogMessageFatal LStack_18;
  
  aVar2 = this->field_0;
  if (((undefined1  [24])aVar2 & (undefined1  [24])0x3) != (undefined1  [24])0x0) {
    if (((undefined1  [24])aVar2 & (undefined1  [24])0x1) != (undefined1  [24])0x0) {
      uVar1 = *(ulong *)((long)&this->field_0 + 8);
      if ((uVar1 & 3) == 0) {
        file = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
        ;
        failure_msg = "!tagged_ptr_.IsDefault()";
        line = 0x20b;
        goto LAB_001caf38;
      }
      puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
      puVar3[1] = 0;
      *(undefined1 *)*puVar3 = 0;
    }
    if (((undefined1  [24])aVar2 & (undefined1  [24])0x2) != (undefined1  [24])0x0) {
      this_00 = (this->field_0)._impl_.recurse_;
      if (this_00 == (RecursiveMessage *)0x0) {
        file = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest_lite.pb.cc"
        ;
        failure_msg = "_impl_.recurse_ != nullptr";
        line = 0x33a9;
LAB_001caf38:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&LStack_18,file,line,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
      }
      Clear(this_00);
    }
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void RecursiveMessage::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.RecursiveMessage)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.payload_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.recurse_ != nullptr);
      _impl_.recurse_->Clear();
    }
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<std::string>();
}